

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O3

void __thiscall irr::scene::CSceneManager::clearAllRegisteredNodesForRendering(CSceneManager *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  pointer pDVar3;
  pointer pDVar4;
  pointer pTVar5;
  pointer pTVar6;
  
  ppIVar1 = (this->CameraList).m_data.
            super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar2 = (this->CameraList).m_data.
            super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->CameraList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CameraList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CameraList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppIVar1 != (pointer)0x0) {
    operator_delete(ppIVar1,(long)ppIVar2 - (long)ppIVar1);
  }
  (this->CameraList).is_sorted = true;
  ppIVar1 = (this->SkyBoxList).m_data.
            super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar2 = (this->SkyBoxList).m_data.
            super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->SkyBoxList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SkyBoxList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SkyBoxList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppIVar1 != (pointer)0x0) {
    operator_delete(ppIVar1,(long)ppIVar2 - (long)ppIVar1);
  }
  (this->SkyBoxList).is_sorted = true;
  pDVar3 = (this->SolidNodeList).m_data.
           super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar4 = (this->SolidNodeList).m_data.
           super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->SolidNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SolidNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SolidNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pDVar3 != (pointer)0x0) {
    operator_delete(pDVar3,(long)pDVar4 - (long)pDVar3);
  }
  (this->SolidNodeList).is_sorted = true;
  pTVar5 = (this->TransparentNodeList).m_data.
           super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar6 = (this->TransparentNodeList).m_data.
           super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->TransparentNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TransparentNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TransparentNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pTVar5 != (pointer)0x0) {
    operator_delete(pTVar5,(long)pTVar6 - (long)pTVar5);
  }
  (this->TransparentNodeList).is_sorted = true;
  pTVar5 = (this->TransparentEffectNodeList).m_data.
           super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar6 = (this->TransparentEffectNodeList).m_data.
           super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->TransparentEffectNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TransparentEffectNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TransparentEffectNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pTVar5 != (pointer)0x0) {
    operator_delete(pTVar5,(long)pTVar6 - (long)pTVar5);
  }
  (this->TransparentEffectNodeList).is_sorted = true;
  ppIVar1 = (this->GuiNodeList).m_data.
            super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar2 = (this->GuiNodeList).m_data.
            super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->GuiNodeList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GuiNodeList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->GuiNodeList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppIVar1 != (pointer)0x0) {
    operator_delete(ppIVar1,(long)ppIVar2 - (long)ppIVar1);
  }
  (this->GuiNodeList).is_sorted = true;
  return;
}

Assistant:

void CSceneManager::clearAllRegisteredNodesForRendering()
{
	CameraList.clear();
	SkyBoxList.clear();
	SolidNodeList.clear();
	TransparentNodeList.clear();
	TransparentEffectNodeList.clear();
	GuiNodeList.clear();
}